

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparspak.cpp
# Opt level: O0

void mmdupd_(int *ehead,int *neqns,int *xadj,int *adjncy,int *delta,int *mdeg,int *dhead,int *dforw,
            int *dbakw,int *qsize,int *llist,int *marker,int *maxint,int *tag)

{
  int iVar1;
  int iVar2;
  int i__2;
  int i__1;
  int *mdeg_local;
  int *delta_local;
  int *adjncy_local;
  int *xadj_local;
  int *neqns_local;
  int *ehead_local;
  
  mmdupd_::mdeg0 = *mdeg + *delta;
  mmdupd_::elmnt = *ehead;
LAB_001811ca:
  if (mmdupd_::elmnt < 1) {
    return;
  }
  mmdupd_::mtag = *tag + mmdupd_::mdeg0;
  if (*maxint <= mmdupd_::mtag) {
    *tag = 1;
    iVar1 = *neqns;
    for (mmdupd_::i = 1; mmdupd_::i <= iVar1; mmdupd_::i = mmdupd_::i + 1) {
      if (marker[(long)mmdupd_::i + -1] < *maxint) {
        marker[(long)mmdupd_::i + -1] = 0;
      }
    }
    mmdupd_::mtag = *tag + mmdupd_::mdeg0;
  }
  mmdupd_::q2head = 0;
  mmdupd_::qxhead = 0;
  mmdupd_::deg0 = 0;
  mmdupd_::link = mmdupd_::elmnt;
LAB_00181296:
  mmdupd_::i = xadj[(long)mmdupd_::link + -1];
  iVar1 = xadj[(long)(mmdupd_::link + 1) + -1];
  mmdupd_::istop = iVar1 + -1;
  mmdupd_::istrt = mmdupd_::i;
  do {
    if (iVar1 + -1 < mmdupd_::i) {
LAB_001813ee:
      mmdupd_::enode = mmdupd_::q2head;
      mmdupd_::iq2 = 1;
LAB_00181404:
      if (mmdupd_::enode < 1) {
        mmdupd_::enode = mmdupd_::qxhead;
        mmdupd_::iq2 = 0;
        goto LAB_001816ca;
      }
      if (dbakw[(long)mmdupd_::enode + -1] != 0) goto LAB_00181997;
      *tag = *tag + 1;
      mmdupd_::deg = mmdupd_::deg0;
      mmdupd_::istrt = xadj[(long)mmdupd_::enode + -1];
      mmdupd_::nabor = adjncy[(long)mmdupd_::istrt + -1];
      if (mmdupd_::nabor == mmdupd_::elmnt) {
        mmdupd_::nabor = adjncy[(long)(mmdupd_::istrt + 1) + -1];
      }
      mmdupd_::link = mmdupd_::nabor;
      if (dforw[(long)mmdupd_::nabor + -1] < 0) {
LAB_001814cc:
        mmdupd_::i = xadj[(long)mmdupd_::link + -1];
        iVar1 = xadj[(long)(mmdupd_::link + 1) + -1];
        mmdupd_::istop = iVar1 + -1;
        mmdupd_::istrt = mmdupd_::i;
        do {
          if (iVar1 + -1 < mmdupd_::i) goto LAB_001818ef;
          mmdupd_::node = adjncy[(long)mmdupd_::i + -1];
          mmdupd_::link = -mmdupd_::node;
          if (mmdupd_::node != mmdupd_::enode) {
            if (mmdupd_::node < 0) goto LAB_001814cc;
            if (mmdupd_::node == 0) goto LAB_001818ef;
            if (qsize[(long)mmdupd_::node + -1] != 0) {
              if (marker[(long)mmdupd_::node + -1] < *tag) {
                marker[(long)mmdupd_::node + -1] = *tag;
                mmdupd_::deg = qsize[(long)mmdupd_::node + -1] + mmdupd_::deg;
              }
              else if (dbakw[(long)mmdupd_::node + -1] == 0) {
                if (dforw[(long)mmdupd_::node + -1] == 2) {
                  qsize[(long)mmdupd_::enode + -1] =
                       qsize[(long)mmdupd_::node + -1] + qsize[(long)mmdupd_::enode + -1];
                  qsize[(long)mmdupd_::node + -1] = 0;
                  marker[(long)mmdupd_::node + -1] = *maxint;
                  dforw[(long)mmdupd_::node + -1] = -mmdupd_::enode;
                  dbakw[(long)mmdupd_::node + -1] = -*maxint;
                }
                else if (dbakw[(long)mmdupd_::node + -1] == 0) {
                  dbakw[(long)mmdupd_::node + -1] = -*maxint;
                }
              }
            }
          }
          mmdupd_::i = mmdupd_::i + 1;
        } while( true );
      }
      mmdupd_::deg = qsize[(long)mmdupd_::nabor + -1] + mmdupd_::deg0;
LAB_001818ef:
      do {
        mmdupd_::deg = (mmdupd_::deg - qsize[(long)mmdupd_::enode + -1]) + 1;
        mmdupd_::fnode = dhead[(long)mmdupd_::deg + -1];
        dforw[(long)mmdupd_::enode + -1] = mmdupd_::fnode;
        dbakw[(long)mmdupd_::enode + -1] = -mmdupd_::deg;
        if (0 < mmdupd_::fnode) {
          dbakw[(long)mmdupd_::fnode + -1] = mmdupd_::enode;
        }
        dhead[(long)mmdupd_::deg + -1] = mmdupd_::enode;
        if (mmdupd_::deg < *mdeg) {
          *mdeg = mmdupd_::deg;
        }
LAB_00181997:
        do {
          mmdupd_::enode = llist[(long)mmdupd_::enode + -1];
          if (mmdupd_::iq2 == 1) goto LAB_00181404;
LAB_001816ca:
          if (mmdupd_::enode < 1) {
            *tag = mmdupd_::mtag;
            mmdupd_::elmnt = llist[(long)mmdupd_::elmnt + -1];
            goto LAB_001811ca;
          }
        } while (dbakw[(long)mmdupd_::enode + -1] != 0);
        *tag = *tag + 1;
        mmdupd_::deg = mmdupd_::deg0;
        mmdupd_::i = xadj[(long)mmdupd_::enode + -1];
        iVar1 = xadj[(long)(mmdupd_::enode + 1) + -1];
        mmdupd_::istop = iVar1 + -1;
        mmdupd_::istrt = mmdupd_::i;
        while ((mmdupd_::i <= iVar1 + -1 &&
               (mmdupd_::nabor = adjncy[(long)mmdupd_::i + -1], mmdupd_::nabor != 0))) {
          if (marker[(long)mmdupd_::nabor + -1] < *tag) {
            marker[(long)mmdupd_::nabor + -1] = *tag;
            mmdupd_::link = mmdupd_::nabor;
            if (dforw[(long)mmdupd_::nabor + -1] < 0) {
              do {
                mmdupd_::j = xadj[(long)mmdupd_::link + -1];
                iVar2 = xadj[(long)(mmdupd_::link + 1) + -1];
                mmdupd_::jstop = iVar2 + -1;
                mmdupd_::jstrt = mmdupd_::j;
                while( true ) {
                  if (iVar2 + -1 < mmdupd_::j) goto LAB_001818d7;
                  mmdupd_::node = adjncy[(long)mmdupd_::j + -1];
                  mmdupd_::link = -mmdupd_::node;
                  if (mmdupd_::node < 0) break;
                  if (mmdupd_::node == 0) goto LAB_001818d7;
                  if (marker[(long)mmdupd_::node + -1] < *tag) {
                    marker[(long)mmdupd_::node + -1] = *tag;
                    mmdupd_::deg = qsize[(long)mmdupd_::node + -1] + mmdupd_::deg;
                  }
                  mmdupd_::j = mmdupd_::j + 1;
                }
              } while( true );
            }
            mmdupd_::deg = qsize[(long)mmdupd_::nabor + -1] + mmdupd_::deg;
          }
LAB_001818d7:
          mmdupd_::i = mmdupd_::i + 1;
        }
      } while( true );
    }
    mmdupd_::enode = adjncy[(long)mmdupd_::i + -1];
    mmdupd_::link = -mmdupd_::enode;
    if (mmdupd_::enode < 0) goto LAB_00181296;
    if (mmdupd_::enode == 0) goto LAB_001813ee;
    if (qsize[(long)mmdupd_::enode + -1] != 0) {
      mmdupd_::deg0 = qsize[(long)mmdupd_::enode + -1] + mmdupd_::deg0;
      marker[(long)mmdupd_::enode + -1] = mmdupd_::mtag;
      if (dbakw[(long)mmdupd_::enode + -1] == 0) {
        if (dforw[(long)mmdupd_::enode + -1] == 2) {
          llist[(long)mmdupd_::enode + -1] = mmdupd_::q2head;
          mmdupd_::q2head = mmdupd_::enode;
        }
        else {
          llist[(long)mmdupd_::enode + -1] = mmdupd_::qxhead;
          mmdupd_::qxhead = mmdupd_::enode;
        }
      }
    }
    mmdupd_::i = mmdupd_::i + 1;
  } while( true );
}

Assistant:

void mmdupd_(int* ehead, int* neqns, int* xadj, int* adjncy, int* delta,
            int* mdeg, int* dhead, int* dforw, int* dbakw, int* qsize,
            int* llist, int* marker, int* maxint, int* tag)
{
    /* System generated locals */
    int i__1, i__2;

    /* Local variables */
    static int node, mtag, link, mdeg0, i, j, enode, fnode, nabor, elmnt,
            istop, jstop, q2head, istrt, jstrt, qxhead, iq2, deg, deg0;


/* *************************************************************** */

/*         INTEGER*2  ADJNCY(1), DBAKW(1) , DFORW(1) , DHEAD(1) , */
/*     1              LLIST(1) , MARKER(1), QSIZE(1) */

/* *************************************************************** */

    /* Parameter adjustments */
    --marker; --llist; --qsize; --dbakw; --dforw; --dhead;
    --adjncy; --xadj;

    /* Function Body */
    mdeg0 = *mdeg + *delta;
    elmnt = *ehead;
L100:
/*            ------------------------------------------------------- */
/*            FOR EACH OF THE NEWLY FORMED ELEMENT, DO THE FOLLOWING. */
/*            (RESET TAG VALUE IF NECESSARY.) */
/*            ------------------------------------------------------- */
    if (elmnt <= 0) {
        return;
    }
    mtag = *tag + mdeg0;
    if (mtag < *maxint) {
        goto L300;
    }
    *tag = 1;
    i__1 = *neqns;
    for (i = 1; i <= i__1; ++i) {
        if (marker[i] < *maxint) {
            marker[i] = 0;
        }
/* L200: */
    }
    mtag = *tag + mdeg0;
L300:
/*            --------------------------------------------- */
/*            CREATE TWO LINKED LISTS FROM NODES ASSOCIATED */
/*            WITH ELMNT: ONE WITH TWO NABORS (Q2HEAD) IN */
/*            ADJACENCY STRUCTURE, AND THE OTHER WITH MORE */
/*            THAN TWO NABORS (QXHEAD).  ALSO COMPUTE DEG0, */
/*            NUMBER OF NODES IN THIS ELEMENT. */
/*            --------------------------------------------- */
    q2head = 0;
    qxhead = 0;
    deg0 = 0;
    link = elmnt;
L400:
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        enode = adjncy[i];
        link = -enode;
        if (enode < 0) {
            goto L400;
        } else if (enode == 0) {
            goto L800;
        } else {
            goto L500;
        }

L500:
        if (qsize[enode] == 0) {
            goto L700;
        }
        deg0 += qsize[enode];
        marker[enode] = mtag;
/*                        ---------------------------------- */
/*                        IF ENODE REQUIRES A DEGREE UPDATE, */
/*                        THEN DO THE FOLLOWING. */
/*                        ---------------------------------- */
        if (dbakw[enode] != 0) {
            goto L700;
        }
/*                            ---------------------------------------
*/
/*                            PLACE EITHER IN QXHEAD OR Q2HEAD LISTS.
*/
/*                            ---------------------------------------
*/
        if (dforw[enode] == 2) {
            goto L600;
        }
        llist[enode] = qxhead;
        qxhead = enode;
        goto L700;
L600:
        llist[enode] = q2head;
        q2head = enode;
L700:
        ;
    }
L800:
/*            -------------------------------------------- */
/*            FOR EACH ENODE IN Q2 LIST, DO THE FOLLOWING. */
/*            -------------------------------------------- */
    enode = q2head;
    iq2 = 1;
L900:
    if (enode <= 0) {
        goto L1500;
    }
    if (dbakw[enode] != 0) {
        goto L2200;
    }
    ++(*tag);
    deg = deg0;
/*                    ------------------------------------------ */
/*                    IDENTIFY THE OTHER ADJACENT ELEMENT NABOR. */
/*                    ------------------------------------------ */
    istrt = xadj[enode];
    nabor = adjncy[istrt];
    if (nabor == elmnt) {
        nabor = adjncy[istrt + 1];
    }
/*                    ------------------------------------------------ */
/*                    IF NABOR IS UNELIMINATED, INCREASE DEGREE COUNT. */
/*                    ------------------------------------------------ */
    link = nabor;
    if (dforw[nabor] < 0) {
        goto L1000;
    }
    deg += qsize[nabor];
    goto L2100;
L1000:
/*                        -------------------------------------------- */
/*                        OTHERWISE, FOR EACH NODE IN THE 2ND ELEMENT, */
/*                        DO THE FOLLOWING. */
/*                        -------------------------------------------- */
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        node = adjncy[i];
        link = -node;
        if (node == enode) {
            goto L1400;
        }
        if (node < 0) {
            goto L1000;
        } else if (node == 0) {
            goto L2100;
        } else {
            goto L1100;
        }

L1100:
        if (qsize[node] == 0) {
            goto L1400;
        }
        if (marker[node] >= *tag) {
            goto L1200;
        }
/*                                -----------------------------------
-- */
/*                                CASE WHEN NODE IS NOT YET CONSIDERED
. */
/*                                -----------------------------------
-- */
        marker[node] = *tag;
        deg += qsize[node];
        goto L1400;
L1200:
/*                            ----------------------------------------
 */
/*                            CASE WHEN NODE IS INDISTINGUISHABLE FROM
 */
/*                            ENODE.  MERGE THEM INTO A NEW SUPERNODE.
 */
/*                            ----------------------------------------
 */
        if (dbakw[node] != 0) {
            goto L1400;
        }
        if (dforw[node] != 2) {
            goto L1300;
        }
        qsize[enode] += qsize[node];
        qsize[node] = 0;
        marker[node] = *maxint;
        dforw[node] = -enode;
        dbakw[node] = -(*maxint);
        goto L1400;
L1300:
/*                            --------------------------------------
*/
/*                            CASE WHEN NODE IS OUTMATCHED BY ENODE.
*/
/*                            --------------------------------------
*/
        if (dbakw[node] == 0) {
            dbakw[node] = -(*maxint);
        }
L1400:
        ;
    }
    goto L2100;
L1500:
/*                ------------------------------------------------ */
/*                FOR EACH ENODE IN THE QX LIST, DO THE FOLLOWING. */
/*                ------------------------------------------------ */
    enode = qxhead;
    iq2 = 0;
L1600:
    if (enode <= 0) {
        goto L2300;
    }
    if (dbakw[enode] != 0) {
        goto L2200;
    }
    ++(*tag);
    deg = deg0;
/*                        --------------------------------- */
/*                        FOR EACH UNMARKED NABOR OF ENODE, */
/*                        DO THE FOLLOWING. */
/*                        --------------------------------- */
    istrt = xadj[enode];
    istop = xadj[enode + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        nabor = adjncy[i];
        if (nabor == 0) {
            goto L2100;
        }
        if (marker[nabor] >= *tag) {
            goto L2000;
        }
        marker[nabor] = *tag;
        link = nabor;
/*                                ------------------------------ */
/*                                IF UNELIMINATED, INCLUDE IT IN */
/*                                DEG COUNT. */
/*                                ------------------------------ */
        if (dforw[nabor] < 0) {
            goto L1700;
        }
        deg += qsize[nabor];
        goto L2000;
L1700:
/*                                    -------------------------------
*/
/*                                    IF ELIMINATED, INCLUDE UNMARKED
*/
/*                                    NODES IN THIS ELEMENT INTO THE
*/
/*                                    DEGREE COUNT. */
/*                                    -------------------------------
*/
        jstrt = xadj[link];
        jstop = xadj[link + 1] - 1;
        i__2 = jstop;
        for (j = jstrt; j <= i__2; ++j) {
            node = adjncy[j];
            link = -node;
            if (node < 0) {
                goto L1700;
            } else if (node == 0) {
                goto L2000;
            } else {
                goto L1800;
            }

L1800:
            if (marker[node] >= *tag) {
                goto L1900;
            }
            marker[node] = *tag;
            deg += qsize[node];
L1900:
            ;
        }
L2000:
        ;
    }
L2100:
/*                    ------------------------------------------- */
/*                    UPDATE EXTERNAL DEGREE OF ENODE IN DEGREE */
/*                    STRUCTURE, AND MDEG (MIN DEG) IF NECESSARY. */
/*                    ------------------------------------------- */
    deg = deg - qsize[enode] + 1;
    fnode = dhead[deg];
    dforw[enode] = fnode;
    dbakw[enode] = -deg;
    if (fnode > 0) {
        dbakw[fnode] = enode;
    }
    dhead[deg] = enode;
    if (deg < *mdeg) {
        *mdeg = deg;
    }
L2200:
/*                    ---------------------------------- */
/*                    GET NEXT ENODE IN CURRENT ELEMENT. */
/*                    ---------------------------------- */
    enode = llist[enode];
    if (iq2 == 1) {
        goto L900;
    }
    goto L1600;
L2300:
/*            ----------------------------- */
/*            GET NEXT ELEMENT IN THE LIST. */
/*            ----------------------------- */
    *tag = mtag;
    elmnt = llist[elmnt];
    goto L100;

}